

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectMeshMaterialList(XFileParser *this,Mesh *pMesh)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  value_type_conflict1 *__x;
  uint uVar3;
  uint uVar4;
  Logger *this_00;
  bool bVar5;
  Material local_e0;
  string objectName;
  string matName;
  
  readHeadOfDataObject(this,(string *)0x0);
  ReadInt(this);
  uVar3 = ReadInt(this);
  if ((uVar3 != 1) &&
     (((long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(pMesh->mPosFaces).
            super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 != (ulong)uVar3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Per-Face material index count does not match face count.",
               (allocator<char> *)&objectName);
    ThrowException(this,&local_e0.mName);
  }
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    uVar4 = ReadInt(this);
    local_e0.mName._M_dataplus._M_p._0_4_ = uVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&pMesh->mFaceMaterials,(uint *)&local_e0);
  }
  if (((this->mIsBinaryFormat == false) && (pcVar2 = this->mP, pcVar2 < this->mEnd)) &&
     (*pcVar2 == ';')) {
    this->mP = pcVar2 + 1;
  }
  while (__x = (pMesh->mFaceMaterials).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
        (ulong)((long)(pMesh->mFaceMaterials).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__x >> 2) <
        (ulong)(((long)(pMesh->mPosFaces).
                       super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pMesh->mPosFaces).
                      super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&pMesh->mFaceMaterials,__x);
  }
  paVar1 = &local_e0.mName.field_2;
  while( true ) {
    GetNextToken_abi_cxx11_(&objectName,this);
    if (objectName._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Unexpected end of file while parsing mesh material list.",
                 (allocator<char> *)&matName);
      ThrowException(this,&local_e0.mName);
    }
    bVar5 = std::operator==(&objectName,"}");
    if (bVar5) break;
    bVar5 = std::operator==(&objectName,"{");
    if (bVar5) {
      GetNextToken_abi_cxx11_(&matName,this);
      local_e0.mName._M_string_length = 0;
      local_e0.mName.field_2._M_local_buf[0] = '\0';
      local_e0.mTextures.
      super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>._M_impl.
      super__Vector_impl_data._4_8_ = 0;
      local_e0.mTextures.
      super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>._M_impl.
      super__Vector_impl_data._12_8_ = 0;
      local_e0.mEmissive.r = 0.0;
      local_e0.mEmissive.g = 0.0;
      local_e0._76_8_ = 0;
      local_e0.mSpecularExponent = 0.0;
      local_e0.mSpecular.r = 0.0;
      local_e0.mSpecular.g = 0.0;
      local_e0.mSpecular.b = 0.0;
      local_e0.mDiffuse.r = 0.0;
      local_e0.mDiffuse.g = 0.0;
      local_e0.mDiffuse.b = 0.0;
      local_e0.mDiffuse.a = 0.0;
      local_e0.mTextures.
      super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      local_e0.sceneIndex = 0xffffffffffffffff;
      local_e0.mIsReference = true;
      local_e0.mName._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_assign((string *)&local_e0);
      std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::push_back
                (&pMesh->mMaterials,&local_e0);
      CheckForClosingBrace(this);
      XFile::Material::~Material(&local_e0);
      std::__cxx11::string::~string((string *)&matName);
    }
    else {
      bVar5 = std::operator==(&objectName,"Material");
      if (bVar5) {
        local_e0.mName._M_string_length = 0;
        local_e0.mName.field_2._M_local_buf[0] = '\0';
        local_e0.mIsReference = false;
        local_e0.mTextures.
        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
        _M_impl.super__Vector_impl_data._4_8_ = 0;
        local_e0.mTextures.
        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
        _M_impl.super__Vector_impl_data._12_8_ = 0;
        local_e0.mEmissive.r = 0.0;
        local_e0.mEmissive.g = 0.0;
        local_e0._76_8_ = 0;
        local_e0.mSpecularExponent = 0.0;
        local_e0.mSpecular.r = 0.0;
        local_e0.mSpecular.g = 0.0;
        local_e0.mSpecular.b = 0.0;
        local_e0.mTextures.
        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        local_e0.mDiffuse.r = 0.0;
        local_e0.mDiffuse.g = 0.0;
        local_e0.mDiffuse.b = 0.0;
        local_e0.mDiffuse.a = 0.0;
        local_e0.sceneIndex = 0xffffffffffffffff;
        local_e0.mName._M_dataplus._M_p = (pointer)paVar1;
        std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::
        emplace_back<Assimp::XFile::Material>(&pMesh->mMaterials,&local_e0);
        XFile::Material::~Material(&local_e0);
        ParseDataObjectMaterial
                  (this,(pMesh->mMaterials).
                        super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      else {
        bVar5 = std::operator==(&objectName,";");
        if (!bVar5) {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"Unknown data object in material list in x file");
          ParseUnknownDataObject(this);
        }
      }
    }
    std::__cxx11::string::~string((string *)&objectName);
  }
  std::__cxx11::string::~string((string *)&objectName);
  return;
}

Assistant:

void XFileParser::ParseDataObjectMeshMaterialList( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read material count
    /*unsigned int numMaterials =*/ ReadInt();
    // read non triangulated face material index count
    unsigned int numMatIndices = ReadInt();

    // some models have a material index count of 1... to be able to read them we
    // replicate this single material index on every face
    if( numMatIndices != pMesh->mPosFaces.size() && numMatIndices != 1)
        ThrowException( "Per-Face material index count does not match face count.");

    // read per-face material indices
    for( unsigned int a = 0; a < numMatIndices; a++)
        pMesh->mFaceMaterials.push_back( ReadInt());

    // in version 03.02, the face indices end with two semicolons.
    // commented out version check, as version 03.03 exported from blender also has 2 semicolons
    if( !mIsBinaryFormat) // && MajorVersion == 3 && MinorVersion <= 2)
    {
        if(mP < mEnd && *mP == ';')
            ++mP;
    }

    // if there was only a single material index, replicate it on all faces
    while( pMesh->mFaceMaterials.size() < pMesh->mPosFaces.size())
        pMesh->mFaceMaterials.push_back( pMesh->mFaceMaterials.front());

    // read following data objects
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.size() == 0)
            ThrowException( "Unexpected end of file while parsing mesh material list.");
        else
        if( objectName == "}")
            break; // material list finished
        else
        if( objectName == "{")
        {
            // template materials
            std::string matName = GetNextToken();
            Material material;
            material.mIsReference = true;
            material.mName = matName;
            pMesh->mMaterials.push_back( material);

            CheckForClosingBrace(); // skip }
        } else
        if( objectName == "Material")
        {
            pMesh->mMaterials.push_back( Material());
            ParseDataObjectMaterial( &pMesh->mMaterials.back());
        } else
        if( objectName == ";")
        {
            // ignore
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in material list in x file");
            ParseUnknownDataObject();
        }
    }
}